

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertTo8Bit(SoundData *this)

{
  uint uVar1;
  uchar *puVar2;
  int i;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  YSRESULT YVar6;
  uint uVar7;
  
  YVar6 = YSOK;
  if (this->bit != 8) {
    if (this->bit == 0x10) {
      uVar1 = this->sizeInBytes;
      uVar7 = uVar1 >> 1;
      puVar3 = (uchar *)operator_new__((ulong)uVar7);
      puVar2 = this->dat;
      puVar5 = puVar3;
      for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 2) {
        *puVar5 = puVar2[uVar4];
        puVar5 = puVar5 + 1;
      }
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
        uVar7 = this->sizeInBytes >> 1;
      }
      this->dat = puVar3;
      this->bit = 8;
      this->sizeInBytes = uVar7;
    }
    else {
      YVar6 = YSERR;
    }
  }
  return YVar6;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertTo8Bit(void)
{
	if(bit==8)
	{
		return YSOK;
	}
	else if(bit==16)
	{
		unsigned char *newDat=new unsigned char [sizeInBytes/2];
		for(int i=0; i<sizeInBytes; i+=2)
		{
			newDat[i/2]=dat[i];
		}
		delete [] dat;
		dat=newDat;
		bit=8;
		sizeInBytes/=2;
		return YSOK;
	}
	return YSERR;
}